

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O2

int has_wext(int sock_fd,char *device,char *ebuf)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  iwreq ireq;
  
  strncpy((char *)&ireq,device,0x10);
  ireq.ifr_ifrn.ifrn_name[0xf] = '\0';
  iVar1 = ioctl(sock_fd,0x8b01,&ireq);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(ebuf,0x100,"%s: SIOCGIWNAME: %s",device,pcVar3);
    iVar1 = (uint)(*piVar2 != 0x13) * 5 + -5;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
has_wext(int sock_fd, const char *device, char *ebuf)
{
	struct iwreq ireq;

	if (is_bonding_device(sock_fd, device))
		return 0;	/* bonding device, so don't even try */

	strlcpy(ireq.ifr_ifrn.ifrn_name, device,
	    sizeof ireq.ifr_ifrn.ifrn_name);
	if (ioctl(sock_fd, SIOCGIWNAME, &ireq) >= 0)
		return 1;	/* yes */
	pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
	    "%s: SIOCGIWNAME: %s", device, pcap_strerror(errno));
	if (errno == ENODEV)
		return PCAP_ERROR_NO_SUCH_DEVICE;
	return 0;
}